

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_ctrl.c
# Opt level: O0

int EVP_PKEY_CTX_get_ecdh_cofactor_mode(EVP_PKEY_CTX *ctx)

{
  int line;
  OSSL_PARAM *p;
  OSSL_PARAM params [2];
  int mode;
  int ret;
  EVP_PKEY_CTX *in_stack_ffffffffffffff28;
  int *buf;
  char *in_stack_ffffffffffffff30;
  OSSL_PARAM *pOVar1;
  OSSL_PARAM *params_00;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  char *file;
  undefined8 uStack_b8;
  void *local_b0;
  size_t sStack_a8;
  size_t local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_68 [10];
  OSSL_PARAM local_40;
  int in_stack_ffffffffffffffe8;
  int local_4;
  
  buf = local_68;
  local_4 = evp_pkey_ctx_getset_ecdh_param_checks(in_stack_ffffffffffffff28);
  if (local_4 == 1) {
    pOVar1 = &local_40;
    OSSL_PARAM_construct_int(in_stack_ffffffffffffff30,buf);
    *(undefined8 *)(buf + 8) = local_78;
    *(undefined8 *)(buf + 4) = local_88;
    *(undefined8 *)(buf + 6) = uStack_80;
    *(undefined8 *)buf = local_98;
    *(undefined8 *)(buf + 2) = uStack_90;
    OSSL_PARAM_construct_end();
    params_00 = pOVar1;
    pOVar1->return_size = local_a0;
    file = in_stack_ffffffffffffff40;
    pOVar1->data = local_b0;
    pOVar1->data_size = sStack_a8;
    pOVar1->key = in_stack_ffffffffffffff40;
    *(undefined8 *)&pOVar1->data_type = uStack_b8;
    line = evp_pkey_ctx_get_params_strict
                     ((EVP_PKEY_CTX *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                      params_00);
    if (line == -2) {
      local_4 = line;
      ERR_new();
      ERR_set_debug(file,line,(char *)params_00);
      ERR_set_error(6,0x93,(char *)0x0);
    }
    else if (line == 1) {
      if ((in_stack_ffffffffffffffe8 < 0) ||
         (local_4 = in_stack_ffffffffffffffe8, 1 < in_stack_ffffffffffffffe8)) {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int EVP_PKEY_CTX_get_ecdh_cofactor_mode(EVP_PKEY_CTX *ctx)
{
    int ret, mode;
    OSSL_PARAM params[2], *p = params;

    ret = evp_pkey_ctx_getset_ecdh_param_checks(ctx);
    if (ret != 1)
        return ret;

    *p++ = OSSL_PARAM_construct_int(OSSL_EXCHANGE_PARAM_EC_ECDH_COFACTOR_MODE,
                                    &mode);
    *p++ = OSSL_PARAM_construct_end();

    ret = evp_pkey_ctx_get_params_strict(ctx, params);

    switch (ret) {
    case -2:
        ERR_raise(ERR_LIB_EVP, EVP_R_COMMAND_NOT_SUPPORTED);
        break;
    case 1:
        ret = mode;
        if (mode < 0 || mode > 1) {
            /*
             * The provider should return either 0 or 1, any other value is a
             * provider error.
             */
            ret = -1;
        }
        break;
    default:
        ret = -1;
        break;
    }

    return ret;
}